

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O1

void write2Dfield(char *fileName,double **field,size_t sizeX,size_t sizeY,size_t offX,size_t offY,
                 char *mode)

{
  size_t __n;
  size_t sVar1;
  FILE *__s;
  size_t sVar2;
  size_t local_40;
  size_t local_38;
  
  local_40 = sizeY;
  local_38 = sizeX;
  if (field == (double **)0x0) {
    puts("The field is invalid.");
    return;
  }
  __s = fopen(fileName,mode);
  if (__s != (FILE *)0x0) {
    fwrite(&local_38,8,1,__s);
    fwrite(&local_40,8,1,__s);
    sVar1 = local_38;
    __n = local_40;
    if (local_38 != 0) {
      sVar2 = 0;
      do {
        fwrite(field[offX + sVar2] + offY,8,__n,__s);
        sVar2 = sVar2 + 1;
      } while (sVar1 != sVar2);
    }
    fclose(__s);
    return;
  }
  printf("The file %s could not be opened.\n",fileName);
  return;
}

Assistant:

void write2Dfield (const char* fileName, REAL** field, size_t sizeX, size_t sizeY, size_t offX, size_t offY, const char *mode)
{
	if (field == NULL)
	{
		printf("The field is invalid.\n");
		return;
	}
	FILE *out = fopen(fileName,mode);
	if (out == NULL)
	{
		printf("The file %s could not be opened.\n",fileName);
		return;
	}
	fwrite(&sizeX,sizeof(size_t),1,out);
	fwrite(&sizeY,sizeof(size_t),1,out);
	for (size_t i = 0; i < sizeX; i++)
	{
		fwrite(field[i+offX]+offY,sizeof(REAL),sizeY,out);
	}
	fclose(out);
	return;
}